

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void cht_DoCheat(player_t *player,int cheat)

{
  ActorFlags2 *pAVar1;
  byte *pbVar2;
  double dVar3;
  uint uVar4;
  APlayerPawn *pAVar5;
  APlayerPawn *pAVar6;
  PClass *pPVar7;
  undefined8 *puVar8;
  uint uVar9;
  undefined4 extraout_var;
  PClassPlayerPawn *morphclass;
  AInventory *pAVar10;
  undefined4 extraout_var_00;
  PClass *pPVar11;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar12;
  undefined8 *puVar13;
  PClassActor *pPVar14;
  AWeapon *pAVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  FState *state;
  byte bVar16;
  int iVar17;
  char *format;
  BYTE *pBVar18;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar19;
  AWeapon *weap;
  char *pcVar20;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar21;
  undefined8 *in_FS_OFFSET;
  bool bVar22;
  VMValue params [1];
  int oldpieces;
  VMReturn ret;
  char msgbuild [32];
  anon_union_16_5_cf148060_for_VMValue_0 local_b8;
  int local_9c;
  VMReturn local_98;
  FName local_88;
  FName local_84;
  FName local_80;
  FName local_7c;
  undefined8 local_78;
  undefined1 local_70 [16];
  DAngle local_60;
  BYTE local_58 [40];
  
  pcVar20 = "";
  switch(cheat) {
  case 0:
    goto switchD_0039e4dc_caseD_0;
  case 1:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 1;
    if ((uVar9 & 1) == 0) {
      pcVar20 = "STSTR_NCON";
    }
    else {
      pcVar20 = "STSTR_NCOFF";
    }
    goto LAB_0039ed3e;
  case 2:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 8;
    pcVar20 = "notarget OFF";
    if ((uVar9 & 8) == 0) {
      pcVar20 = "notarget ON";
    }
    break;
  case 3:
    if ((player->mo == (APlayerPawn *)0x0) || (player->health < 0)) break;
    pPVar14 = PClass::FindActor("Chainsaw");
    pAVar10 = AActor::FindInventory(&player->mo->super_AActor,pPVar14,false);
    if (pAVar10 == (AInventory *)0x0) {
      AActor::GiveInventoryType(&player->mo->super_AActor,pPVar14);
    }
    pcVar20 = "STSTR_CHOPPERS";
    goto LAB_0039ed3e;
  case 4:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"keys",1);
    cht_Give(player,"armor",1);
    pcVar20 = "STSTR_KFAADDED";
    goto LAB_0039ed3e;
  case 5:
    cht_Give(player,"backpack",1);
    cht_Give(player,"weapons",1);
    cht_Give(player,"ammo",1);
    cht_Give(player,"armor",1);
    pcVar20 = "STSTR_FAADDED";
    goto LAB_0039ed3e;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    iVar17 = cheat + -6;
    if (iVar17 == 4) {
      level.flags2._0_1_ = (byte)level.flags2 ^ 2;
    }
    else {
      pAVar5 = player->mo;
      if ((pAVar5 != (APlayerPawn *)0x0) && (-1 < player->health)) {
        pcVar20 = cht_DoCheat::BeholdPowers[iVar17];
        pPVar14 = PClass::FindActor(pcVar20);
        pAVar10 = AActor::FindInventory(&pAVar5->super_AActor,pPVar14,false);
        if (pAVar10 == (AInventory *)0x0) {
          if (iVar17 == 0) {
            cht_Give(player,"InvulnerabilitySphere",1);
          }
          else {
            cht_Give(player,pcVar20,1);
            if (cheat == 7) {
              P_GiveBody(&player->mo->super_AActor,-100,0);
            }
          }
        }
        else {
          (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
        }
      }
    }
    pcVar20 = "STSTR_BEHOLDX";
    goto LAB_0039ed3e;
  case 0xf:
    cht_Give(player,"MedPatch",1);
    cht_Give(player,"MedicalKit",1);
    pcVar20 = "SurgeryKit";
    goto LAB_0039ed23;
  case 0x10:
    pcVar20 = "AmmoSatchel";
    goto LAB_0039ed23;
  case 0x11:
    cht_Give(player,"UpgradeStamina",10);
    pcVar20 = "UpgradeAccuracy";
LAB_0039ed23:
    cht_Give(player,pcVar20,1);
    pcVar20 = "TXT_GOTSTUFF";
    goto LAB_0039ed3e;
  case 0x12:
    if (((player->cheats & 2) == 0) && (player->playerstate == '\0')) {
      if (player->mo != (APlayerPawn *)0x0) {
        (player->mo->super_AActor).health = deh.GodHealth;
      }
      player->health = deh.GodHealth;
    }
    goto switchD_0039e4dc_caseD_0;
  case 0x13:
    uVar9 = P_Massacre();
    pBVar18 = "s";
    if (uVar9 == 1) {
      pBVar18 = "";
    }
    pcVar20 = (char *)local_58;
    mysnprintf(pcVar20,0x20,"%d Monster%s Killed",(ulong)uVar9,pBVar18);
    break;
  case 0x14:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 0x20;
    pcVar20 = "chasecam OFF";
    if ((uVar9 & 0x20) == 0) {
      pcVar20 = "chasecam ON";
    }
    R_ResetViewInterpolation();
    break;
  case 0x15:
    pAVar5 = player->mo;
    if (pAVar5 == (APlayerPawn *)0x0) break;
    uVar9 = (pAVar5->super_AActor).flags.Value;
    uVar4 = (pAVar5->super_AActor).flags7.Value;
    (pAVar5->super_AActor).flags7.Value = uVar4 ^ 0x20000;
    if ((uVar4 >> 0x11 & 1) == 0) {
      (pAVar5->super_AActor).flags.Value = uVar9 | 0x200;
      pAVar1 = &(pAVar5->super_AActor).flags2;
      *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 0x10;
      pcVar20 = "TXT_LIGHTER";
    }
    else {
      (pAVar5->super_AActor).flags.Value = uVar9 & 0xfffffdff;
      pAVar1 = &(pAVar5->super_AActor).flags2;
      *(byte *)&pAVar1->Value = (byte)pAVar1->Value & 0xef;
      pcVar20 = "TXT_GRAVITY";
    }
    goto LAB_0039ed3e;
  case 0x16:
    local_b8.i = (gameinfo.gametype != GAME_Heretic) + 0x55;
    morphclass = (PClassPlayerPawn *)PClass::FindClass((FName *)&local_b8.field_1);
    pcVar20 = cht_Morph(player,morphclass,true);
    break;
  case 0x17:
    if ((player->mo == (APlayerPawn *)0x0) || (player->health < 0)) break;
    pAVar10 = AActor::FindInventory
                        (&player->mo->super_AActor,
                         (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
    if (pAVar10 == (AInventory *)0x0) {
      AActor::GiveInventoryType
                (&player->mo->super_AActor,
                 (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass);
      pcVar20 = "TXT_CHEATPOWERON";
    }
    else {
      (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
      pcVar20 = "TXT_CHEATPOWEROFF";
    }
    goto LAB_0039ed3e;
  case 0x18:
    pAVar5 = player->mo;
    if ((pAVar5 == (APlayerPawn *)0x0) || (player->playerstate != '\0')) break;
    if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
      iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
      (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var,iVar17);
    }
    iVar17 = *(int *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1fc)
    ;
    (player->mo->super_AActor).health = iVar17;
    player->health = iVar17;
    pcVar20 = "TXT_CHEATHEALTH";
    goto LAB_0039ed3e;
  case 0x19:
    cht_Give(player,"keys",1);
    pcVar20 = "TXT_CHEATKEYS";
    goto LAB_0039ed3e;
  case 0x1a:
    if (player->morphTics != 0) {
      return;
    }
    pAVar5 = player->mo;
    if (pAVar5 == (APlayerPawn *)0x0) {
      return;
    }
    if ((pAVar5->super_AActor).health < 1) {
      return;
    }
    aVar21 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)
             (pAVar5->super_AActor).Inventory.field_0.p;
    if (aVar21 != (AInventory *)0x0) {
      paVar19 = &(pAVar5->super_AActor).Inventory.field_0;
      do {
        pPVar7 = AWeapon::RegistrationInfo.MyClass;
        if (((aVar21.p)->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
          iVar17 = (**((aVar21.p)->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                             (aVar21.p);
          ((aVar21.p)->super_AActor).super_DThinker.super_DObject.Class =
               (PClass *)CONCAT44(extraout_var_00,iVar17);
        }
        pPVar11 = ((aVar21.p)->super_AActor).super_DThinker.super_DObject.Class;
        bVar22 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar7 && bVar22) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar22 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar7) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        paVar12 = &((aVar21.p)->super_AActor).Inventory.field_0;
        if ((bVar22) &&
           ((((aVar21.p)->field_0x4fd & 2) == 0 ||
            (aVar21.p[1].super_AActor.super_DThinker.super_DObject._vptr_DObject !=
             (_func_int **)0x0)))) {
          (*((aVar21.p)->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(aVar21.p);
          paVar12 = paVar19;
        }
        aVar21 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)paVar12->p;
        paVar19 = paVar12;
      } while (aVar21.p != (AInventory *)0x0);
    }
    pcVar20 = "TXT_CHEATIDKFA";
    goto LAB_0039ed3e;
  case 0x1b:
    cht_Suicide(player);
    pcVar20 = "TXT_CHEATIDDQD";
    goto LAB_0039ed3e;
  case 0x1c:
    iVar17 = 0x19;
    do {
      cht_Give(player,"artifacts",1);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    goto LAB_0039eaf5;
  case 0x1d:
    cht_Give(player,"puzzlepieces",1);
LAB_0039eaf5:
    pcVar20 = "TXT_CHEATARTIFACTS3";
    goto LAB_0039ed3e;
  case 0x1e:
    pAVar5 = player->mo;
    if (pAVar5 != (APlayerPawn *)0x0) {
      if (deathmatch.Value == 0) {
        local_70._0_8_ = (pAVar5->super_AActor).Angles.Yaw.Degrees;
        local_78 = 0;
        local_60.Degrees = (double)local_70._0_8_;
        P_AimLineAttack((AActor *)(local_70 + 8),(DAngle *)pAVar5,8192.0,
                        (FTranslatedLineTarget *)local_70,(DAngle *)0x0,(int)&local_78,(AActor *)0x0
                        ,(AActor *)0x0);
        local_7c.Index = 0xcf;
        local_80.Index = 0x40;
        P_LineAttack(&pAVar5->super_AActor,&local_60,8192.0,(DAngle *)(local_70 + 8),1000000,
                     &local_7c,&local_80,0,(FTranslatedLineTarget *)0x0,(int *)0x0);
      }
      break;
    }
    format = "What do you want to kill outside of a game?\n";
    goto LAB_0039f0fe;
  case 0x1f:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 0x400;
    pcVar20 = "No more ogre armor";
    if ((uVar9 >> 10 & 1) == 0) {
      pcVar20 = "\"Quake with fear!\"";
    }
    break;
  case 0x20:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 4;
    if ((uVar9 & 4) == 0) {
      pcVar20 = "TXT_LEADBOOTSON";
    }
    else {
      pcVar20 = "TXT_LEADBOOTSOFF";
    }
    goto LAB_0039ed3e;
  case 0x21:
    cht_Give(player,"HealthTraining",1);
    pcVar20 = "TXT_MIDASTOUCH";
    goto LAB_0039ed3e;
  case 0x22:
    if ((player->mo != (APlayerPawn *)0x0) && (-1 < player->health)) {
      if (cht_DoCheat::gsp == (VMFunction *)0x0) {
        local_84.Index = 0x5b;
        local_88.Index = 0x5d;
        cht_DoCheat::gsp = PClass::FindFunction(&local_84,&local_88);
      }
      if (cht_DoCheat::gsp != (VMFunction *)0x0) {
        local_b8.field_1.a = player->mo;
        local_b8.field_1.atag = 1;
        local_b8.field_3.Type = '\x03';
        local_98.Location = &local_9c;
        local_9c = 1;
        local_98.TagOfs = 0;
        local_98.RegType = '\0';
        GlobalVMStack::__tls_init();
        VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,cht_DoCheat::gsp,
                           (VMValue *)&local_b8.field_1,1,&local_98,1,(VMException **)0x0);
        pAVar5 = player->mo;
        pPVar14 = PClass::FindActor(NAME_Sigil);
        pAVar15 = (AWeapon *)AActor::FindInventory(&pAVar5->super_AActor,pPVar14,false);
        if (pAVar15 != (AWeapon *)0x0) {
          if (local_9c == 5) {
            (*(pAVar15->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject._vptr_DObject[4])(pAVar15);
          }
          else {
            player->PendingWeapon = pAVar15;
          }
        }
        if (local_b8.field_3.Type == '\x02') {
          FString::~FString((FString *)&local_b8.field_1);
        }
      }
    }
    break;
  case 0x23:
    if ((player->playerstate == '\0') || (player->mo == (APlayerPawn *)0x0)) break;
    bVar22 = DObject::IsKindOf((DObject *)player->mo,APlayerChunk::RegistrationInfo.MyClass);
    if (!bVar22) {
      player->playerstate = '\0';
      pAVar5 = player->mo;
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_01,iVar17);
      }
      iVar17 = *(int *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults +
                       0x1fc);
      pAVar5 = player->mo;
      (pAVar5->super_AActor).health = iVar17;
      player->health = iVar17;
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_02,iVar17);
      }
      player->viewheight =
           *(double *)
            (((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x500);
      pAVar5 = player->mo;
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_03,iVar17);
      }
      pAVar6 = player->mo;
      (pAVar6->super_AActor).flags.Value =
           *(uint *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1bc);
      if ((pAVar6->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_04,iVar17);
      }
      pAVar5 = player->mo;
      (pAVar5->super_AActor).flags2.Value =
           *(uint *)(((pAVar6->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1c0);
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_05,iVar17);
      }
      pAVar6 = player->mo;
      (pAVar6->super_AActor).flags3.Value =
           *(uint *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1c4);
      if ((pAVar6->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_06,iVar17);
      }
      pAVar5 = player->mo;
      (pAVar5->super_AActor).flags4.Value =
           *(uint *)(((pAVar6->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1c8);
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_07,iVar17);
      }
      pAVar6 = player->mo;
      (pAVar6->super_AActor).flags5.Value =
           *(uint *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1cc);
      if ((pAVar6->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_08,iVar17);
      }
      pAVar5 = player->mo;
      (pAVar5->super_AActor).flags6.Value =
           *(uint *)(((pAVar6->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1d0);
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_09,iVar17);
      }
      pAVar6 = player->mo;
      (pAVar6->super_AActor).flags7.Value =
           *(uint *)(((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x1d4);
      pbVar2 = (byte *)((long)&(pAVar6->super_AActor).renderflags.Value + 1);
      *pbVar2 = *pbVar2 & 0x7f;
      if ((pAVar6->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar6->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar6);
        (pAVar6->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_10,iVar17);
      }
      pAVar5 = player->mo;
      (pAVar5->super_AActor).Height =
           *(double *)
            (((pAVar6->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x180);
      if ((pAVar5->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar17 = (**(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar5);
        (pAVar5->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var_11,iVar17);
      }
      pAVar6 = player->mo;
      (pAVar6->super_AActor).radius =
           *(double *)
            (((pAVar5->super_AActor).super_DThinker.super_DObject.Class)->Defaults + 0x178);
      (pAVar6->super_AActor).special1 = 0;
      AActor::SetState(&pAVar6->super_AActor,(pAVar6->super_AActor).SpawnState,false);
      pAVar5 = player->mo;
      if (((pAVar5->super_AActor).flags2.Value & 0x10000) == 0) {
        (pAVar5->super_AActor).Translation =
             ((int)player + 0xfe81a1b0U >> 5) * 0x3cf3cf3d & 0xff | 0x10000;
      }
      (pAVar5->super_AActor).DamageType.super_FName.Index = 0;
      if (player->ReadyWeapon != (AWeapon *)0x0) {
        state = AWeapon::GetUpState(player->ReadyWeapon);
        P_SetPsprite(player,PSP_WEAPON,state,false);
      }
      if (player->morphTics != 0) {
        P_UndoPlayerMorph(player,player,0,false);
      }
      break;
    }
    format = "Unable to resurrect. Player is no longer connected to its body.\n";
LAB_0039f0fe:
    Printf(format);
    break;
  case 0x24:
    player->cheats = player->cheats & 0xffffefbf;
    pcVar20 = "Frozen player properties turned off";
    break;
  case 0x25:
    bVar16 = bglobal._16_1_ ^ 2;
    if (((bVar16 >> 1 ^ bglobal._16_1_) & 1) == 0) {
      pcVar20 = "TXT_FREEZEOFF";
      bglobal._16_1_ = bVar16;
    }
    else {
      pcVar20 = "TXT_FREEZEON";
      bglobal._16_1_ = bVar16;
    }
    goto LAB_0039ed3e;
  case 0x26:
    cht_Give(player,"ArtiInvulnerability",1);
    pcVar20 = "Valador\'s Ring of Invunerability";
    break;
  case 0x27:
    cht_Give(player,"ArtiInvisibility",1);
    pcVar20 = "Shadowsphere";
    break;
  case 0x28:
    cht_Give(player,"ArtiHealth",1);
    pcVar20 = "Quartz Flask";
    break;
  case 0x29:
    cht_Give(player,"ArtiSuperHealth",1);
    pcVar20 = "Mystic Urn";
    break;
  case 0x2a:
    cht_Give(player,"ArtiTomeOfPower",1);
    pcVar20 = "Tyketto\'s Tome of Power";
    break;
  case 0x2b:
    cht_Give(player,"ArtiTorch",1);
    pcVar20 = "Torch";
    break;
  case 0x2c:
    cht_Give(player,"ArtiTimeBomb",1);
    pcVar20 = "Delmintalintar\'s Time Bomb of the Ancients";
    break;
  case 0x2d:
    cht_Give(player,"ArtiEgg",1);
    pcVar20 = "Torpol\'s Morph Ovum";
    break;
  case 0x2e:
    cht_Give(player,"ArtiFly",1);
    pcVar20 = "Inhilicon\'s Wings of Wrath";
    break;
  case 0x2f:
    cht_Give(player,"ArtiTeleport",1);
    pcVar20 = "Darchala\'s Chaos Device";
    break;
  case 0x30:
    iVar17 = 0x10;
    pcVar20 = "All artifacts!";
    do {
      cht_Give(player,"artifacts",1);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    break;
  case 0x31:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 0x8000000;
    if ((uVar9 >> 0x1b & 1) == 0) {
      pcVar20 = "TXT_BUDDHAON";
    }
    else {
      pcVar20 = "TXT_BUDDHAOFF";
    }
    goto LAB_0039ed3e;
  case 0x32:
    uVar9 = player->cheats;
    bVar22 = (uVar9 >> 0x1e & 1) != 0;
    uVar4 = uVar9 ^ 0x40000000 | 1;
    if (bVar22) {
      uVar4 = uVar9 & 0xbffffffe;
    }
    pcVar20 = "STSTR_NCOFF";
    if (!bVar22) {
      pcVar20 = "STSTR_NC2ON";
    }
    player->cheats = uVar4;
    pcVar20 = FStringTable::operator()(&GStrings,pcVar20);
    dVar3 = (player->mo->super_AActor).Vel.X;
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      (player->mo->super_AActor).Vel.X = 1.52587890625e-05;
    }
    break;
  case 0x33:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 0x1000000;
    if ((uVar9 >> 0x18 & 1) == 0) {
      pcVar20 = "TXT_BUDDHA2ON";
    }
    else {
      pcVar20 = "TXT_BUDDHA2OFF";
    }
LAB_0039ed3e:
    pcVar20 = FStringTable::operator()(&GStrings,pcVar20);
    break;
  case 0x34:
    uVar9 = player->cheats;
    player->cheats = uVar9 ^ 0x2000000;
    pcVar20 = "STSTR_DQD2OFF";
    if ((uVar9 >> 0x19 & 1) == 0) {
      pcVar20 = "STSTR_DQD2ON";
    }
    goto LAB_0039ef9f;
  }
switchD_0039e4dc_default:
  if (*pcVar20 != '\0') {
    if ((player_t *)(&players + (long)consoleplayer * 0x54) == player) {
      Printf("%s\n",pcVar20);
    }
    else if (cheat != 0x14) {
      puVar8 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1ea) * 0x18));
      do {
        puVar13 = puVar8;
        puVar8 = (undefined8 *)*puVar13;
      } while (*(int *)(puVar13 + 1) != 0x1ea);
      Printf("%s cheats: %s\n",*(undefined8 *)(puVar13[2] + 0x28),pcVar20);
    }
  }
  return;
switchD_0039e4dc_caseD_0:
  uVar9 = player->cheats;
  player->cheats = uVar9 ^ 2;
  pcVar20 = "STSTR_DQDOFF";
  if ((uVar9 & 2) == 0) {
    pcVar20 = "STSTR_DQDON";
  }
LAB_0039ef9f:
  pcVar20 = FStringTable::operator()(&GStrings,pcVar20);
  ST_SetNeedRefresh();
  goto switchD_0039e4dc_default;
}

Assistant:

void cht_DoCheat (player_t *player, int cheat)
{
	static const char * const BeholdPowers[9] =
	{
		"PowerInvulnerable",
		"PowerStrength",
		"PowerInvisibility",
		"PowerIronFeet",
		"MapRevealer",
		"PowerLightAmp",
		"PowerShadow",
		"PowerMask",
		"PowerTargeter",
	};
	PClassActor *type;
	AInventory *item;
	const char *msg = "";
	char msgbuild[32];
	int i;

	switch (cheat)
	{
	case CHT_IDDQD:
		if (!(player->cheats & CF_GODMODE) && player->playerstate == PST_LIVE)
		{
			if (player->mo)
				player->mo->health = deh.GodHealth;

			player->health = deh.GodHealth;
		}
		// fall through to CHT_GOD
	case CHT_GOD:
		player->cheats ^= CF_GODMODE;
		if (player->cheats & CF_GODMODE)
			msg = GStrings("STSTR_DQDON");
		else
			msg = GStrings("STSTR_DQDOFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA:
		player->cheats ^= CF_BUDDHA;
		if (player->cheats & CF_BUDDHA)
			msg = GStrings("TXT_BUDDHAON");
		else
			msg = GStrings("TXT_BUDDHAOFF");
		break;

	case CHT_GOD2:
		player->cheats ^= CF_GODMODE2;
		if (player->cheats & CF_GODMODE2)
			msg = GStrings("STSTR_DQD2ON");
		else
			msg = GStrings("STSTR_DQD2OFF");
		ST_SetNeedRefresh();
		break;

	case CHT_BUDDHA2:
		player->cheats ^= CF_BUDDHA2;
		if (player->cheats & CF_BUDDHA2)
			msg = GStrings("TXT_BUDDHA2ON");
		else
			msg = GStrings("TXT_BUDDHA2OFF");
		break;

	case CHT_NOCLIP:
		player->cheats ^= CF_NOCLIP;
		if (player->cheats & CF_NOCLIP)
			msg = GStrings("STSTR_NCON");
		else
			msg = GStrings("STSTR_NCOFF");
		break;

	case CHT_NOCLIP2:
		player->cheats ^= CF_NOCLIP2;
		if (player->cheats & CF_NOCLIP2)
		{
			player->cheats |= CF_NOCLIP;
			msg = GStrings("STSTR_NC2ON");
		}
		else
		{
			player->cheats &= ~CF_NOCLIP;
			msg = GStrings("STSTR_NCOFF");
		}
		if (player->mo->Vel.X == 0) player->mo->Vel.X = MinVel;	// force some lateral movement so that internal variables are up to date
		break;

	case CHT_NOVELOCITY:
		player->cheats ^= CF_NOVELOCITY;
		if (player->cheats & CF_NOVELOCITY)
			msg = GStrings("TXT_LEADBOOTSON");
		else
			msg = GStrings("TXT_LEADBOOTSOFF");
		break;

	case CHT_FLY:
		if (player->mo != NULL)
		{
			player->mo->flags7 ^= MF7_FLYCHEAT;
			if (player->mo->flags7 & MF7_FLYCHEAT)
			{
				player->mo->flags |= MF_NOGRAVITY;
				player->mo->flags2 |= MF2_FLY;
				msg = GStrings("TXT_LIGHTER");
			}
			else
			{
				player->mo->flags &= ~MF_NOGRAVITY;
				player->mo->flags2 &= ~MF2_FLY;
				msg = GStrings("TXT_GRAVITY");
			}
		}
		break;

	case CHT_MORPH:
		msg = cht_Morph (player, static_cast<PClassPlayerPawn *>(PClass::FindClass (gameinfo.gametype == GAME_Heretic ? NAME_ChickenPlayer : NAME_PigPlayer)), true);
		break;

	case CHT_NOTARGET:
		player->cheats ^= CF_NOTARGET;
		if (player->cheats & CF_NOTARGET)
			msg = "notarget ON";
		else
			msg = "notarget OFF";
		break;

	case CHT_ANUBIS:
		player->cheats ^= CF_FRIGHTENING;
		if (player->cheats & CF_FRIGHTENING)
			msg = "\"Quake with fear!\"";
		else
			msg = "No more ogre armor";
		break;

	case CHT_CHASECAM:
		player->cheats ^= CF_CHASECAM;
		if (player->cheats & CF_CHASECAM)
			msg = "chasecam ON";
		else
			msg = "chasecam OFF";
		R_ResetViewInterpolation ();
		break;

	case CHT_CHAINSAW:
		if (player->mo != NULL && player->health >= 0)
		{
			type = PClass::FindActor("Chainsaw");
			if (player->mo->FindInventory (type) == NULL)
			{
				player->mo->GiveInventoryType (type);
			}
			msg = GStrings("STSTR_CHOPPERS");
		}
		// [RH] The original cheat also set powers[pw_invulnerability] to true.
		// Since this is a timer and not a boolean, it effectively turned off
		// the invulnerability powerup, although it looks like it was meant to
		// turn it on.
		break;

	case CHT_POWER:
		if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true);
			if (item != NULL)
			{
				item->Destroy ();
				msg = GStrings("TXT_CHEATPOWEROFF");
			}
			else
			{
				player->mo->GiveInventoryType (RUNTIME_CLASS(APowerWeaponLevel2));
				msg = GStrings("TXT_CHEATPOWERON");
			}
		}
		break;

	case CHT_IDKFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "keys");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_KFAADDED");
		break;

	case CHT_IDFA:
		cht_Give (player, "backpack");
		cht_Give (player, "weapons");
		cht_Give (player, "ammo");
		cht_Give (player, "armor");
		msg = GStrings("STSTR_FAADDED");
		break;

	case CHT_BEHOLDV:
	case CHT_BEHOLDS:
	case CHT_BEHOLDI:
	case CHT_BEHOLDR:
	case CHT_BEHOLDA:
	case CHT_BEHOLDL:
	case CHT_PUMPUPI:
	case CHT_PUMPUPM:
	case CHT_PUMPUPT:
		i = cheat - CHT_BEHOLDV;

		if (i == 4)
		{
			level.flags2 ^= LEVEL2_ALLMAP;
		}
		else if (player->mo != NULL && player->health >= 0)
		{
			item = player->mo->FindInventory(PClass::FindActor(BeholdPowers[i]));
			if (item == NULL)
			{
				if (i != 0)
				{
					cht_Give(player, BeholdPowers[i]);
					if (cheat == CHT_BEHOLDS)
					{
						P_GiveBody (player->mo, -100);
					}
				}
				else
				{
					// Let's give the item here so that the power doesn't need colormap information.
					cht_Give(player, "InvulnerabilitySphere");
				}
			}
			else
			{
				item->Destroy ();
			}
		}
		msg = GStrings("STSTR_BEHOLDX");
		break;

	case CHT_MASSACRE:
		{
			int killcount = P_Massacre ();
			// killough 3/22/98: make more intelligent about plural
			// Ty 03/27/98 - string(s) *not* externalized
			mysnprintf (msgbuild, countof(msgbuild), "%d Monster%s Killed", killcount, killcount==1 ? "" : "s");
			msg = msgbuild;
		}
		break;

	case CHT_HEALTH:
		if (player->mo != NULL && player->playerstate == PST_LIVE)
		{
			player->health = player->mo->health = player->mo->GetDefault()->health;
			msg = GStrings("TXT_CHEATHEALTH");
		}
		break;

	case CHT_KEYS:
		cht_Give (player, "keys");
		msg = GStrings("TXT_CHEATKEYS");
		break;

	// [GRB]
	case CHT_RESSURECT:
		if (player->playerstate != PST_LIVE && player->mo != nullptr)
		{
			if (player->mo->IsKindOf(RUNTIME_CLASS(APlayerChunk)))
			{
				Printf("Unable to resurrect. Player is no longer connected to its body.\n");
			}
			else
			{
				player->playerstate = PST_LIVE;
				player->health = player->mo->health = player->mo->GetDefault()->health;
				player->viewheight = ((APlayerPawn *)player->mo->GetDefault())->ViewHeight;
				player->mo->flags = player->mo->GetDefault()->flags;
				player->mo->flags2 = player->mo->GetDefault()->flags2;
				player->mo->flags3 = player->mo->GetDefault()->flags3;
				player->mo->flags4 = player->mo->GetDefault()->flags4;
				player->mo->flags5 = player->mo->GetDefault()->flags5;
				player->mo->flags6 = player->mo->GetDefault()->flags6;
				player->mo->flags7 = player->mo->GetDefault()->flags7;
				player->mo->renderflags &= ~RF_INVISIBLE;
				player->mo->Height = player->mo->GetDefault()->Height;
				player->mo->radius = player->mo->GetDefault()->radius;
				player->mo->special1 = 0;	// required for the Hexen fighter's fist attack. 
											// This gets set by AActor::Die as flag for the wimpy death and must be reset here.
				player->mo->SetState (player->mo->SpawnState);
				if (!(player->mo->flags2 & MF2_DONTTRANSLATE))
				{
					player->mo->Translation = TRANSLATION(TRANSLATION_Players, BYTE(player-players));
				}
				player->mo->DamageType = NAME_None;
				if (player->ReadyWeapon != nullptr)
				{
					P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetUpState());
				}

				if (player->morphTics)
				{
					P_UndoPlayerMorph(player, player);
				}

			}
		}
		break;

	case CHT_GIMMIEA:
		cht_Give (player, "ArtiInvulnerability");
		msg = "Valador's Ring of Invunerability";
		break;

	case CHT_GIMMIEB:
		cht_Give (player, "ArtiInvisibility");
		msg = "Shadowsphere";
		break;

	case CHT_GIMMIEC:
		cht_Give (player, "ArtiHealth");
		msg = "Quartz Flask";
		break;

	case CHT_GIMMIED:
		cht_Give (player, "ArtiSuperHealth");
		msg = "Mystic Urn";
		break;

	case CHT_GIMMIEE:
		cht_Give (player, "ArtiTomeOfPower");
		msg = "Tyketto's Tome of Power";
		break;

	case CHT_GIMMIEF:
		cht_Give (player, "ArtiTorch");
		msg = "Torch";
		break;

	case CHT_GIMMIEG:
		cht_Give (player, "ArtiTimeBomb");
		msg = "Delmintalintar's Time Bomb of the Ancients";
		break;

	case CHT_GIMMIEH:
		cht_Give (player, "ArtiEgg");
		msg = "Torpol's Morph Ovum";
		break;

	case CHT_GIMMIEI:
		cht_Give (player, "ArtiFly");
		msg = "Inhilicon's Wings of Wrath";
		break;

	case CHT_GIMMIEJ:
		cht_Give (player, "ArtiTeleport");
		msg = "Darchala's Chaos Device";
		break;

	case CHT_GIMMIEZ:
		for (int i=0;i<16;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = "All artifacts!";
		break;

	case CHT_TAKEWEAPS:
		if (player->morphTics || player->mo == NULL || player->mo->health <= 0)
		{
			return;
		}
		{
			// Take away all weapons that are either non-wimpy or use ammo.
			AInventory **invp = &player->mo->Inventory, **lastinvp;
			for (item = *invp; item != NULL; item = *invp)
			{
				lastinvp = invp;
				invp = &(*invp)->Inventory;
				if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
				{
					AWeapon *weap = static_cast<AWeapon *> (item);
					if (!(weap->WeaponFlags & WIF_WIMPY_WEAPON) ||
						weap->AmmoType1 != NULL)
					{
						item->Destroy ();
						invp = lastinvp;
					}
				}
			}
		}
		msg = GStrings("TXT_CHEATIDKFA");
		break;

	case CHT_NOWUDIE:
		cht_Suicide (player);
		msg = GStrings("TXT_CHEATIDDQD");
		break;

	case CHT_ALLARTI:
		for (int i=0;i<25;i++)
		{
			cht_Give (player, "artifacts");
		}
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_PUZZLE:
		cht_Give (player, "puzzlepieces");
		msg = GStrings("TXT_CHEATARTIFACTS3");
		break;

	case CHT_MDK:
		if (player->mo == NULL)
		{
			Printf ("What do you want to kill outside of a game?\n");
		}
		else if (!deathmatch)
		{
			// Don't allow this in deathmatch even with cheats enabled, because it's
			// a very very cheap kill.
			P_LineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE,
				P_AimLineAttack (player->mo, player->mo->Angles.Yaw, PLAYERMISSILERANGE), TELEFRAG_DAMAGE,
				NAME_MDK, NAME_BulletPuff);
		}
		break;

	case CHT_DONNYTRUMP:
		cht_Give (player, "HealthTraining");
		msg = GStrings("TXT_MIDASTOUCH");
		break;

	case CHT_LEGO:
		if (player->mo != NULL && player->health >= 0)
		{
			static VMFunction *gsp = nullptr;
			if (gsp == nullptr) gsp = PClass::FindFunction(NAME_Sigil, NAME_GiveSigilPiece);
			if (gsp)
			{
				VMValue params[1] = { player->mo };
				VMReturn ret;
				int oldpieces = 1;
				ret.IntAt(&oldpieces);
				GlobalVMStack.Call(gsp, params, 1, &ret, 1, nullptr);
				item = player->mo->FindInventory(PClass::FindActor(NAME_Sigil));

				if (item != NULL)
				{
					if (oldpieces == 5)
					{
						item->Destroy();
					}
					else
					{
						player->PendingWeapon = static_cast<AWeapon *> (item);
					}
				}
			}
		}
		break;

	case CHT_PUMPUPH:
		cht_Give (player, "MedPatch");
		cht_Give (player, "MedicalKit");
		cht_Give (player, "SurgeryKit");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPP:
		cht_Give (player, "AmmoSatchel");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_PUMPUPS:
		cht_Give (player, "UpgradeStamina", 10);
		cht_Give (player, "UpgradeAccuracy");
		msg = GStrings("TXT_GOTSTUFF");
		break;

	case CHT_CLEARFROZENPROPS:
		player->cheats &= ~(CF_FROZEN|CF_TOTALLYFROZEN);
		msg = "Frozen player properties turned off";
		break;

	case CHT_FREEZE:
		bglobal.changefreeze ^= 1;
		if (bglobal.freeze ^ bglobal.changefreeze)
		{
			msg = GStrings("TXT_FREEZEON");
		}
		else
		{
			msg = GStrings("TXT_FREEZEOFF");
		}
		break;
	}

	if (!*msg)              // [SO] Don't print blank lines!
		return;

	if (player == &players[consoleplayer])
		Printf ("%s\n", msg);
	else if (cheat != CHT_CHASECAM)
		Printf ("%s cheats: %s\n", player->userinfo.GetName(), msg);
}